

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O3

Aig_Man_t * Aig_ManPartSplitOne(Aig_Man_t *p,Vec_Ptr_t *vNodes,Vec_Int_t **pvPio2Id)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  Aig_Man_t *pNew;
  Vec_Int_t *vPio2Id;
  int *piVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  
  Aig_ManIncrementTravId(p);
  iVar2 = vNodes->nSize;
  if (0 < iVar2) {
    lVar3 = 0;
    do {
      pvVar1 = vNodes->pArray[lVar3];
      *(int *)((long)pvVar1 + 0x20) = p->nTravIds;
      *(undefined8 *)((long)pvVar1 + 0x28) = 0;
      lVar3 = lVar3 + 1;
      iVar2 = vNodes->nSize;
    } while (lVar3 < iVar2);
  }
  pNew = Aig_ManStart(iVar2);
  vPio2Id = (Vec_Int_t *)malloc(0x10);
  vPio2Id->nCap = 100;
  vPio2Id->nSize = 0;
  piVar4 = (int *)malloc(400);
  vPio2Id->pArray = piVar4;
  iVar2 = vNodes->nSize;
  if (0 < iVar2) {
    lVar3 = 0;
    do {
      Aig_ManPartSplitOne_rec(pNew,p,(Aig_Obj_t *)vNodes->pArray[lVar3],vPio2Id);
      lVar3 = lVar3 + 1;
      iVar2 = vNodes->nSize;
      uVar5 = (ulong)iVar2;
    } while (lVar3 < (long)uVar5);
    if (0 < iVar2) {
      lVar3 = 0;
      do {
        pvVar1 = vNodes->pArray[lVar3];
        uVar6 = *(uint *)&(*(Aig_Obj_t **)((long)pvVar1 + 0x28))->field_0x18 >> 6;
        uVar7 = *(uint *)((long)pvVar1 + 0x18) >> 6;
        if (uVar6 != uVar7) {
          if (uVar7 <= uVar6) {
            __assert_fail("Aig_ObjRefs((Aig_Obj_t *)pObj->pData) < Aig_ObjRefs(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigPartSat.c"
                          ,199,
                          "Aig_Man_t *Aig_ManPartSplitOne(Aig_Man_t *, Vec_Ptr_t *, Vec_Int_t **)");
          }
          Aig_ObjCreateCo(pNew,*(Aig_Obj_t **)((long)pvVar1 + 0x28));
          Vec_IntPush(vPio2Id,*(int *)((long)pvVar1 + 0x24));
          uVar5 = (ulong)(uint)vNodes->nSize;
        }
        lVar3 = lVar3 + 1;
        iVar2 = (int)uVar5;
      } while (lVar3 < iVar2);
    }
  }
  if (pNew->nObjs[6] + pNew->nObjs[5] == iVar2) {
    *pvPio2Id = vPio2Id;
    return pNew;
  }
  __assert_fail("Aig_ManNodeNum(pNew) == Vec_PtrSize(vNodes)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigPartSat.c"
                ,0xcb,"Aig_Man_t *Aig_ManPartSplitOne(Aig_Man_t *, Vec_Ptr_t *, Vec_Int_t **)");
}

Assistant:

Aig_Man_t * Aig_ManPartSplitOne( Aig_Man_t * p, Vec_Ptr_t * vNodes, Vec_Int_t ** pvPio2Id )
{
    Vec_Int_t * vPio2Id;
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    // mark these nodes
    Aig_ManIncrementTravId( p );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        Aig_ObjSetTravIdCurrent( p, pObj );
        pObj->pData = NULL;
    }
    // add these nodes in a DFS order
    pNew = Aig_ManStart( Vec_PtrSize(vNodes) );
    vPio2Id = Vec_IntAlloc( 100 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        Aig_ManPartSplitOne_rec( pNew, p, pObj, vPio2Id );
    // add the POs
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        if ( Aig_ObjRefs((Aig_Obj_t *)pObj->pData) != Aig_ObjRefs(pObj) )
        {
            assert( Aig_ObjRefs((Aig_Obj_t *)pObj->pData) < Aig_ObjRefs(pObj) );
            Aig_ObjCreateCo( pNew, (Aig_Obj_t *)pObj->pData );
            Vec_IntPush( vPio2Id, Aig_ObjId(pObj) );
        }
    assert( Aig_ManNodeNum(pNew) == Vec_PtrSize(vNodes) );
    *pvPio2Id = vPio2Id;
    return pNew;
}